

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void FromWabtValueTypes(ValueTypes *types,wasm_valtype_vec_t *out)

{
  ValueType type;
  wasm_valkind_t kind;
  size_type sVar1;
  const_reference pvVar2;
  wasm_valtype_t *pwVar3;
  ulong local_20;
  size_t i;
  wasm_valtype_vec_t *out_local;
  ValueTypes *types_local;
  
  sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  wasm_valtype_vec_new_uninitialized(out,sVar1);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
    if (sVar1 <= local_20) break;
    pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](types,local_20);
    type.enum_ = pvVar2->enum_;
    type.type_index_ = pvVar2->type_index_;
    kind = FromWabtValueType(type);
    pwVar3 = wasm_valtype_new(kind);
    out->data[local_20] = pwVar3;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void FromWabtValueTypes(const ValueTypes& types,
                               wasm_valtype_vec_t* out) {
  wasm_valtype_vec_new_uninitialized(out, types.size());
  for (size_t i = 0; i < types.size(); ++i) {
    out->data[i] = wasm_valtype_new(FromWabtValueType(types[i]));
  }
}